

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estring.cpp
# Opt level: O1

Vec2f __thiscall embree::string_to_Vec2f(embree *this,string *str)

{
  char *pcVar1;
  int *piVar2;
  undefined8 uVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  undefined4 extraout_XMM0_Db;
  anon_union_8_2_4062524c_for_Vec2<float>_1 aVar7;
  char *local_50 [2];
  char local_40 [16];
  
  pcVar1 = (str->_M_dataplus)._M_p;
  piVar2 = __errno_location();
  iVar4 = *piVar2;
  *piVar2 = 0;
  fVar5 = strtof(pcVar1,local_50);
  if (local_50[0] == pcVar1) {
    std::__throw_invalid_argument("stof");
  }
  else if (*piVar2 != 0x22) {
    if (*piVar2 == 0) {
      *piVar2 = iVar4;
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)str);
    std::__cxx11::string::operator=((string *)str,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    pcVar1 = (str->_M_dataplus)._M_p;
    iVar4 = *piVar2;
    *piVar2 = 0;
    fVar6 = strtof(pcVar1,local_50);
    aVar7.field_0.y = (float)extraout_XMM0_Db;
    aVar7.field_0.x = fVar6;
    if (local_50[0] != pcVar1) {
      if (*piVar2 != 0) {
        if (*piVar2 != 0x22) goto LAB_001dd8ed;
        aVar7 = (anon_union_8_2_4062524c_for_Vec2<float>_1)std::__throw_out_of_range("stof");
      }
      *piVar2 = iVar4;
LAB_001dd8ed:
      *(float *)this = fVar5;
      *(float *)(this + 4) = aVar7.field_0.x;
      return (Vec2f)aVar7;
    }
    goto LAB_001dd928;
  }
  std::__throw_out_of_range("stof");
LAB_001dd928:
  uVar3 = std::__throw_invalid_argument("stof");
  if (*piVar2 == 0) {
    *piVar2 = iVar4;
  }
  _Unwind_Resume(uVar3);
}

Assistant:

Vec2f string_to_Vec2f ( std::string str )
  {
    size_t next = 0;
    const float x = std::stof(str,&next); str = str.substr(next+1);
    const float y = std::stof(str,&next);
    return Vec2f(x,y);
  }